

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall testing::internal::String::ShowWideCString(String *this,wchar_t *wide_c_str)

{
  String *this_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  String SVar2;
  String local_28;
  wchar_t *local_18;
  wchar_t *wide_c_str_local;
  
  local_18 = wide_c_str;
  wide_c_str_local = (wchar_t *)this;
  if (wide_c_str == (wchar_t *)0x0) {
    String(this,"(null)");
    sVar1 = extraout_RDX;
  }
  else {
    WideStringToUtf8((internal *)&local_28,wide_c_str,-1);
    this_00 = (String *)c_str(&local_28);
    String(this,(char *)this_00);
    ~String(this_00);
    sVar1 = extraout_RDX_00;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String String::ShowWideCString(const wchar_t * wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String(internal::WideStringToUtf8(wide_c_str, -1).c_str());
}